

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_bbdpre.c
# Opt level: O1

int cvCfnWrapper(sunindextype NlocalB,sunrealtype t,N_Vector yB,void *cvode_mem)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  
  lVar1 = *(long *)((long)cvode_mem + 0xa70);
  lVar2 = *(long *)(lVar1 + 0x40);
  lVar3 = *(long *)(lVar2 + 0x58);
  if (*(long *)(lVar3 + 8) == 0) {
    iVar4 = 0;
  }
  else {
    iVar4 = (**(code **)(lVar1 + 0xa8))(cvode_mem,*(undefined8 *)(lVar1 + 0x1f8),0);
    if (iVar4 == 0) {
      iVar4 = (**(code **)(lVar3 + 8))
                        (t,NlocalB,*(undefined8 *)(lVar1 + 0x1f8),yB,*(undefined8 *)(lVar2 + 0x40));
      return iVar4;
    }
    iVar4 = -1;
    cvProcessError((CVodeMem)cvode_mem,-1,0x3b3,"cvCfnWrapper",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_bbdpre.c"
                   ,"Bad t for interpolation.");
  }
  return iVar4;
}

Assistant:

static int cvCfnWrapper(sunindextype NlocalB, sunrealtype t, N_Vector yB,
                        void* cvode_mem)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  CVBBDPrecDataB cvbbdB_mem;
  int flag;

  cv_mem     = (CVodeMem)cvode_mem;
  ca_mem     = cv_mem->cv_adj_mem;
  cvB_mem    = ca_mem->ca_bckpbCrt;
  cvbbdB_mem = (CVBBDPrecDataB)(cvB_mem->cv_pmem);
  if (cvbbdB_mem->cfnB == NULL) { return (0); }

  /* Get forward solution from interpolation */
  flag = ca_mem->ca_IMget(cv_mem, t, ca_mem->ca_ytmp, NULL);
  if (flag != CV_SUCCESS)
  {
    cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__, MSGBBD_BAD_TINTERP);
    return (-1);
  }

  /* Call user's adjoint cfnB routine */
  return cvbbdB_mem->cfnB(NlocalB, t, ca_mem->ca_ytmp, yB, cvB_mem->cv_user_data);
}